

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Set_Record_R_PDU::Encode(Set_Record_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Set_Record_R_PDU *)&this[-1].super_Simulation_Management_Header.m_ReceivingEntityID,in_RSI
        );
  return;
}

Assistant:

void Set_Record_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding1
           << m_ui16Padding
           << m_ui32Padding
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}